

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

int __thiscall
kratos::FunctionCallStmt::clone
          (FunctionCallStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  UserException *this_00;
  string local_40;
  
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Not implemented","");
  UserException::UserException(this_00,&local_40);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Stmt> FunctionCallStmt::clone() const { throw UserException("Not implemented"); }